

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Singular.hpp
# Opt level: O2

bool mserialize::detail::singular_tuple(string_view full_tag,string_view tag,int max_recursion)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  string_view tag_00;
  string_view local_38;
  
  uVar2 = (ulong)(tag._len != 0);
  local_38._ptr = tag._ptr + uVar2;
  lVar3 = tag._len - uVar2;
  local_38._len = 0;
  if (lVar3 != 0) {
    local_38._len = lVar3 - 1;
  }
  do {
    tag_00 = tag_pop(&local_38);
    if (tag_00._len == 0) break;
    bVar1 = singular_impl(full_tag,tag_00,max_recursion);
  } while (bVar1);
  return tag_00._len == 0;
}

Assistant:

inline bool singular_tuple(string_view full_tag, string_view tag, int max_recursion)
{
  tag.remove_prefix(1); // drop (
  tag.remove_suffix(1); // drop )
  for (string_view elem_tag = tag_pop(tag); ! elem_tag.empty(); elem_tag = tag_pop(tag))
  {
    if (! singular_impl(full_tag, elem_tag, max_recursion)) { return false; }
  }
  return true;
}